

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawPolygonDecal
          (PixelGameEngine *this,Decal *decal,
          vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *pos,
          vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *uv,Pixel tint)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar4;
  reference pvVar5;
  reference pvVar6;
  float fVar7;
  float fVar8;
  value_type local_b8;
  uint local_b0;
  uint32_t i;
  undefined1 local_a0 [8];
  DecalInstance di;
  vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *uv_local;
  vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *pos_local;
  Decal *decal_local;
  PixelGameEngine *this_local;
  Pixel tint_local;
  
  di._104_8_ = uv;
  DecalInstance::DecalInstance((DecalInstance *)local_a0);
  local_a0 = (undefined1  [8])decal;
  sVar1 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::size(pos)
  ;
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)sVar1;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)&di,
             sVar1 & 0xffffffff);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             &di.pos.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ulong)di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &di.uv.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ulong)di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::resize
            ((vector<olc::Pixel,_std::allocator<olc::Pixel>_> *)
             &di.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,
             (ulong)di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_b0 = 0;
      local_b0 <
      di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_b0 = local_b0 + 1) {
    pvVar2 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[](pos,(ulong)local_b0);
    fVar7 = pvVar2->x * (this->vInvScreenSize).x;
    pvVar2 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[](pos,(ulong)local_b0);
    fVar8 = pvVar2->y * (this->vInvScreenSize).y;
    v2d_generic<float>::v2d_generic(&local_b8,fVar7 + fVar7 + -1.0,-(fVar8 + fVar8 + -1.0));
    pvVar3 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(ulong)local_b0);
    *pvVar3 = local_b8;
    pvVar2 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)di._104_8_,(ulong)local_b0);
    pvVar3 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di.pos.
                            super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_b0);
    *pvVar3 = *pvVar2;
    paVar4 = &std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator[]
                        ((vector<olc::Pixel,_std::allocator<olc::Pixel>_> *)
                         &di.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(ulong)local_b0)->field_0;
    paVar4->field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)tint.field_0;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &di.uv.
                         super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_b0);
    *pvVar5 = 1.0;
  }
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = this->nDecalMode;
  pvVar6 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                     (&this->vLayers,(ulong)this->nTargetLayer);
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&pvVar6->vecDecalInstance,(value_type *)local_a0);
  DecalInstance::~DecalInstance((DecalInstance *)local_a0);
  return;
}

Assistant:

void PixelGameEngine::DrawPolygonDecal(olc::Decal *decal, const std::vector<olc::vf2d> &pos, const std::vector<olc::vf2d> &uv, const olc::Pixel tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.points = uint32_t(pos.size());
		di.pos.resize(di.points);
		di.uv.resize(di.points);
		di.w.resize(di.points);
		di.tint.resize(di.points);
		for (uint32_t i = 0; i < di.points; i++)
		{
			di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			di.uv[i] = uv[i];
			di.tint[i] = tint;
			di.w[i] = 1.0f;
		}
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}